

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage9.cpp
# Opt level: O0

void test(bool verbose)

{
  test_resource **monitored;
  bool bVar1;
  ostream *poVar2;
  longlong lVar3;
  undefined1 local_288 [8];
  pstring mstring;
  undefined1 local_268 [8];
  pstring astring;
  test_resource_monitor trm;
  test_resource tr;
  default_resource_guard drg;
  test_resource_monitor drm;
  undefined1 local_108 [8];
  test_resource dr;
  Framer framer;
  bool verbose_local;
  
  Framer::Framer((Framer *)&dr.m_pmr_,"Monitoring",verbose);
  std::pmr::test_resource::test_resource((test_resource *)local_108,"default");
  std::pmr::test_resource_monitor::test_resource_monitor
            ((test_resource_monitor *)&drg,(test_resource *)local_108);
  std::pmr::default_resource_guard::default_resource_guard
            ((default_resource_guard *)&tr.m_pmr_,(memory_resource *)local_108);
  std::pmr::test_resource::set_verbose((test_resource *)local_108,verbose);
  std::pmr::test_resource::test_resource((test_resource *)&trm.m_monitored_,"object");
  monitored = &trm.m_monitored_;
  std::pmr::test_resource_monitor::test_resource_monitor
            ((test_resource_monitor *)&astring.m_buffer_,(test_resource *)monitored);
  std::pmr::test_resource::set_verbose((test_resource *)monitored,verbose);
  std::pmr::polymorphic_allocator_P0339R5<std::byte>::polymorphic_allocator
            ((polymorphic_allocator_P0339R5<std::byte> *)&mstring.m_buffer_,
             (memory_resource *)monitored);
  pstring::pstring((pstring *)local_268,"barfool",(allocator_type)mstring.m_buffer_);
  bVar1 = std::pmr::test_resource_monitor::is_total_up((test_resource_monitor *)&astring.m_buffer_);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"trm.is_total_up()");
    std::operator<<(poVar2," != true\n");
  }
  lVar3 = std::pmr::test_resource_monitor::delta_blocks_in_use
                    ((test_resource_monitor *)&astring.m_buffer_);
  if (lVar3 != 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"trm.delta_blocks_in_use()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"1");
    std::operator<<(poVar2,'\n');
    lVar3 = std::pmr::test_resource_monitor::delta_blocks_in_use
                      ((test_resource_monitor *)&astring.m_buffer_);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,lVar3);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::operator<<(poVar2,'\n');
  }
  std::pmr::test_resource_monitor::reset((test_resource_monitor *)&astring.m_buffer_);
  pstring::pstring((pstring *)local_288,(pstring *)local_268);
  bVar1 = std::pmr::test_resource_monitor::is_in_use_same((test_resource_monitor *)&drg);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"drm.is_in_use_same()");
    std::operator<<(poVar2," != true\n");
  }
  bVar1 = std::pmr::test_resource_monitor::is_total_same((test_resource_monitor *)&drg);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"drm.is_total_same()");
    std::operator<<(poVar2," != true\n");
  }
  pstring::~pstring((pstring *)local_288);
  pstring::~pstring((pstring *)local_268);
  std::pmr::test_resource::~test_resource((test_resource *)&trm.m_monitored_);
  std::pmr::default_resource_guard::~default_resource_guard((default_resource_guard *)&tr.m_pmr_);
  std::pmr::test_resource::~test_resource((test_resource *)local_108);
  Framer::~Framer((Framer *)&dr.m_pmr_);
  return;
}

Assistant:

void test(bool verbose)
{
    Framer framer{ "Monitoring", verbose };

    std::pmr::test_resource           dr{ "default" };
    std::pmr::test_resource_monitor  drm{ dr };
    std::pmr::default_resource_guard drg{ &dr };
    dr.set_verbose(verbose);

    std::pmr::test_resource          tr{ "object" };
    std::pmr::test_resource_monitor trm{ tr };
    tr.set_verbose(verbose);

    pstring astring{ "barfool", &tr };
    ASSERT(trm.is_total_up());
    ASSERT_EQ(trm.delta_blocks_in_use(), 1);
    trm.reset();

    pstring mstring{ std::move(astring) };

    ASSERT(drm.is_in_use_same()); // Did not allocate`bstring` with this
    ASSERT(drm.is_total_same());  // Did not allocate /anything/ with this
}